

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O0

bool crnlib::pixel_format_helpers::is_pixel_format_non_srgb(pixel_format fmt)

{
  pixel_format fmt_local;
  bool local_1;
  
  if ((((fmt == PIXEL_FMT_DXT5A) || (fmt == PIXEL_FMT_3DC)) || (fmt == PIXEL_FMT_DXT5_AGBR)) ||
     (((fmt == PIXEL_FMT_DXT5_xGBR || (fmt == PIXEL_FMT_DXT5_xGxR)) ||
      ((fmt == PIXEL_FMT_DXN || (fmt == PIXEL_FMT_DXT5_CCxY)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool is_pixel_format_non_srgb(pixel_format fmt) {
  switch (fmt) {
    case PIXEL_FMT_3DC:
    case PIXEL_FMT_DXN:
    case PIXEL_FMT_DXT5A:
    case PIXEL_FMT_DXT5_CCxY:
    case PIXEL_FMT_DXT5_xGxR:
    case PIXEL_FMT_DXT5_xGBR:
    case PIXEL_FMT_DXT5_AGBR:
      return true;
    default:
      break;
  }
  return false;
}